

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fn.hpp
# Opt level: O2

void __thiscall
rangeless::fn::impl::
seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<rangeless::fn::get::second>::gen<rangeless::fn::impl::to_seq::gen<std::map<int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>_>_>_>_>
::seq(seq<rangeless::fn::impl::concat::gen<rangeless::fn::impl::transform<rangeless::fn::get::second>::gen<rangeless::fn::impl::to_seq::gen<std::map<int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>_>_>_>_>
      *this,gen<rangeless::fn::impl::transform<rangeless::fn::get::second>::gen<rangeless::fn::impl::to_seq::gen<std::map<int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>_>_>_>
            *gen)

{
  (this->m_current).m_empty = true;
  concat::
  gen<rangeless::fn::impl::transform<rangeless::fn::get::second>::gen<rangeless::fn::impl::to_seq::gen<std::map<int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<rangeless::fn::impl::X,_std::allocator<rangeless::fn::impl::X>_>_>_>_>_>_>_>
  ::gen(&this->m_gen,gen);
  this->m_started = false;
  this->m_ended = false;
  this->m_resumable = false;
  return;
}

Assistant:

seq(Gen gen) 
            : m_gen( std::move(gen) ) // NB: must use parentheses here!
        {}